

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

void gguf_get_meta_data(gguf_context *ctx,void *data)

{
  char *__src;
  size_type __n;
  gguf_context *in_RSI;
  vector<signed_char,_std::allocator<signed_char>_> buf;
  vector<signed_char,_std::allocator<signed_char>_> *this;
  undefined1 in_stack_ffffffffffffffe7;
  vector<signed_char,_std::allocator<signed_char>_> *in_stack_ffffffffffffffe8;
  
  this = (vector<signed_char,_std::allocator<signed_char>_> *)&stack0xffffffffffffffd8;
  std::vector<signed_char,_std::allocator<signed_char>_>::vector
            ((vector<signed_char,_std::allocator<signed_char>_> *)0x1922fd);
  gguf_write_to_buf(in_RSI,in_stack_ffffffffffffffe8,(bool)in_stack_ffffffffffffffe7);
  __src = std::vector<signed_char,_std::allocator<signed_char>_>::data
                    ((vector<signed_char,_std::allocator<signed_char>_> *)0x192327);
  __n = std::vector<signed_char,_std::allocator<signed_char>_>::size
                  ((vector<signed_char,_std::allocator<signed_char>_> *)&stack0xffffffffffffffd8);
  memcpy(in_RSI,__src,__n);
  std::vector<signed_char,_std::allocator<signed_char>_>::~vector(this);
  return;
}

Assistant:

void gguf_get_meta_data(const struct gguf_context * ctx, void * data) {
    std::vector<int8_t> buf;
    gguf_write_to_buf(ctx, buf, /*only_meta =*/ true);
    memcpy(data, buf.data(), buf.size());
}